

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::Read3dmReferencedComponentIndex
          (ON_BinaryArchive *this,Type component_type,int *component_index)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ON_2dex *pOVar4;
  ON_DimStyle **ppOVar5;
  ON_UUID *pOVar6;
  ON_ManifestMapItem *pOVar7;
  ON_ManifestMapItem *archive_current_dim_style_map_item;
  ON_ManifestMapItem *map_item;
  undefined8 local_60;
  undefined8 local_58;
  ON_ComponentManifestItem *local_50;
  ON_ComponentManifestItem *item;
  ON_DimStyle *archive_dim_style;
  int archive_dim_style_index;
  ON_2dex ts_to_ds;
  int archive_text_style_index;
  int updated_component_index;
  int archive_component_index;
  int *component_index_local;
  ON_BinaryArchive *pOStack_18;
  Type component_type_local;
  ON_BinaryArchive *this_local;
  
  if (component_index != (int *)0x0) {
    *component_index = -0x7fffffff;
  }
  archive_text_style_index = -0x7fffffff;
  _updated_component_index = component_index;
  component_index_local._7_1_ = component_type;
  pOStack_18 = this;
  bVar1 = ReadInt(this,&archive_text_style_index);
  if (bVar1) {
    if ((archive_text_style_index < 0) ||
       (bVar1 = ReferencedComponentIndexMapping(this), iVar3 = archive_text_style_index, !bVar1)) {
      if (_updated_component_index != (int *)0x0) {
        *_updated_component_index = archive_text_style_index;
      }
      this_local._7_1_ = true;
    }
    else {
      ts_to_ds.j = archive_text_style_index;
      if (component_index_local._7_1_ == TextStyle) {
        component_index_local._7_1_ = DimStyle;
        ts_to_ds.i = archive_text_style_index;
        archive_text_style_index = -0x7fffffff;
        if ((-1 < iVar3) &&
           (iVar2 = ON_SimpleArray<ON_2dex>::Count
                              (&this->m_text_style_to_dim_style_archive_index_map), iVar3 < iVar2))
        {
          pOVar4 = ON_SimpleArray<ON_2dex>::operator[]
                             (&this->m_text_style_to_dim_style_archive_index_map,ts_to_ds.i);
          unique0x00012000 = *pOVar4;
          if ((ts_to_ds.i == archive_dim_style._4_4_) && (-1 < (long)unique0x00012000)) {
            archive_text_style_index = archive_dim_style_index;
          }
        }
      }
      if (component_index_local._7_1_ == DimStyle) {
        iVar2 = Archive3dmVersion(this);
        iVar3 = archive_text_style_index;
        if (iVar2 < 0x33) {
          if (_updated_component_index != (int *)0x0) {
            *_updated_component_index = archive_text_style_index;
          }
          return true;
        }
        archive_dim_style._0_4_ = archive_text_style_index;
        if ((-1 < archive_text_style_index) &&
           (iVar2 = ON_SimpleArray<ON_DimStyle_*>::Count(&this->m_archive_dim_style_table),
           iVar3 < iVar2)) {
          ppOVar5 = ON_SimpleArray<ON_DimStyle_*>::operator[]
                              (&this->m_archive_dim_style_table,(int)archive_dim_style);
          item = (ON_ComponentManifestItem *)*ppOVar5;
          if ((ON_DimStyle *)item != (ON_DimStyle *)0x0) {
            bVar1 = ON_ModelComponent::ParentIdIsNotNil((ON_ModelComponent *)item);
            if (bVar1) {
              if (_updated_component_index != (int *)0x0) {
                *_updated_component_index = archive_text_style_index;
              }
              return true;
            }
            pOVar6 = ON_ModelComponent::Id((ON_ModelComponent *)item);
            local_60._0_4_ = pOVar6->Data1;
            local_60._4_2_ = pOVar6->Data2;
            local_60._6_2_ = pOVar6->Data3;
            local_58 = *(undefined8 *)pOVar6->Data4;
            local_50 = ON_ComponentManifest::ItemFromId(&this->m_manifest,DimStyle,*pOVar6);
            _map_item = ON_ComponentManifestItem::Id(local_50);
            pOVar6 = ON_ModelComponent::Id((ON_ModelComponent *)item);
            bVar1 = ::operator==((ON_UUID_struct *)&map_item,pOVar6);
            if (bVar1) {
              archive_text_style_index = ON_ComponentManifestItem::Index(local_50);
            }
          }
        }
      }
      pOVar7 = ON_ManifestMap::MapItemFromSourceIndex
                         (&this->m_manifest_map,component_index_local._7_1_,archive_text_style_index
                         );
      bVar1 = ON_ManifestMapItem::SourceAndDestinationAreSet(pOVar7);
      if ((bVar1) && (iVar3 = ON_ManifestMapItem::DestinationIndex(pOVar7), iVar3 != -0x7fffffff)) {
        ts_to_ds.j = ON_ManifestMapItem::DestinationIndex(pOVar7);
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                   ,0xbf6,"","Unable to update component index.");
        if ((byte)(component_index_local._7_1_ - Image) < 0xc ||
            component_index_local._7_1_ == HistoryRecord) {
          switch((long)&switchD_0076bfa0::switchdataD_00a01d1c +
                 (long)(int)(&switchD_0076bfa0::switchdataD_00a01d1c)
                            [(byte)(component_index_local._7_1_ - Image)]) {
          case 0x76bfa2:
            break;
          case 0x76bfa7:
            break;
          case 0x76bfac:
            ts_to_ds.j = ON_ModelComponent::Index(&ON_Material::Default.super_ON_ModelComponent);
            break;
          case 0x76bfc0:
            ts_to_ds.j = ON_ModelComponent::Index(&ON_Linetype::Continuous.super_ON_ModelComponent);
            break;
          case 0x76bfd4:
            break;
          case 0x76bfd9:
            break;
          case 0x76bfde:
            if (this->m_archive_current_dim_style != (ON_DimStyle *)0x0) {
              iVar3 = ON_ModelComponent::Index
                                (&this->m_archive_current_dim_style->super_ON_ModelComponent);
              pOVar7 = ON_ManifestMap::MapItemFromSourceIndex(&this->m_manifest_map,DimStyle,iVar3);
              bVar1 = ON_ManifestMapItem::SourceAndDestinationAreSet(pOVar7);
              if ((bVar1) &&
                 (iVar3 = ON_ManifestMapItem::DestinationIndex(pOVar7), iVar3 != -0x7fffffff)) {
                ts_to_ds.j = ON_ManifestMapItem::DestinationIndex(pOVar7);
              }
            }
            break;
          case 0x76c058:
            break;
          case 0x76c05a:
            break;
          case 0x76c05c:
            break;
          case 0x76c05e:
            break;
          case 0x76c060:
          }
        }
      }
      if (_updated_component_index != (int *)0x0) {
        *_updated_component_index = ts_to_ds.j;
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BinaryArchive::Read3dmReferencedComponentIndex(
  ON_ModelComponent::Type component_type,
  int* component_index
  )
{
  if (nullptr != component_index)
    *component_index = ON_UNSET_INT_INDEX;

  int archive_component_index = ON_UNSET_INT_INDEX;
  if (!ReadInt(&archive_component_index))
    return false;
  
  if (archive_component_index < 0 || false == ReferencedComponentIndexMapping() )
  {
    // system component with a persistent negative index
    if (nullptr != component_index)
      *component_index = archive_component_index;
    return true;
  }

  int updated_component_index = archive_component_index;

  if (ON_ModelComponent::Type::TextStyle == component_type)
  {
    component_type = ON_ModelComponent::Type::DimStyle;
    const int archive_text_style_index = archive_component_index;
    archive_component_index = ON_UNSET_INT_INDEX;
    if (archive_text_style_index >= 0
      && archive_text_style_index < m_text_style_to_dim_style_archive_index_map.Count()
      )
    {
      const ON_2dex ts_to_ds = m_text_style_to_dim_style_archive_index_map[archive_text_style_index];
      if (archive_text_style_index == ts_to_ds.i && ts_to_ds.j >= 0)
      {
        archive_component_index = ts_to_ds.j;
      }
    }
  }

  if (ON_ModelComponent::Type::DimStyle == component_type)
  {
    if (this->Archive3dmVersion() <= 50)
    {
      if (nullptr != component_index)
        *component_index = archive_component_index;

      return true;
    }
    const int archive_dim_style_index = archive_component_index;
    if (archive_dim_style_index >= 0
      && archive_dim_style_index < m_archive_dim_style_table.Count()
      )
    {
      const ON_DimStyle* archive_dim_style = m_archive_dim_style_table[archive_dim_style_index];
      if (nullptr != archive_dim_style)
      {
        if (archive_dim_style->ParentIdIsNotNil())
        {
          // override dimstyle - not in manifests or dimstyle table.
          if (nullptr != component_index)
            *component_index = archive_component_index;

          return true;
        }

        const ON_ComponentManifestItem& item = m_manifest.ItemFromId(ON_ModelComponent::Type::DimStyle,archive_dim_style->Id());
        if ( item.Id() == archive_dim_style->Id() )
        {
          archive_component_index = item.Index();
        }
      }
    }
  }

  const ON_ManifestMapItem& map_item = m_manifest_map.MapItemFromSourceIndex(component_type,archive_component_index);
  if (map_item.SourceAndDestinationAreSet() && ON_UNSET_INT_INDEX != map_item.DestinationIndex())
  {
    updated_component_index = map_item.DestinationIndex();
  }
  else
  {
    ON_ERROR("Unable to update component index.");

    // Get something that might work when possible
    switch (component_type)
    {
    case ON_ModelComponent::Type::Image:
      break;
    case ON_ModelComponent::Type::TextureMapping:
      break;
    case ON_ModelComponent::Type::Material:
      updated_component_index = ON_Material::Default.Index();
      break;
    case ON_ModelComponent::Type::LinePattern:
      updated_component_index = ON_Linetype::Continuous.Index();
      break;
    case ON_ModelComponent::Type::Layer:
      break;
    case ON_ModelComponent::Type::Group:
      break;

    case ON_ModelComponent::Type::TextStyle:
    case ON_ModelComponent::Type::DimStyle:
      if (nullptr != m_archive_current_dim_style)
      {
        const ON_ManifestMapItem& archive_current_dim_style_map_item = m_manifest_map.MapItemFromSourceIndex(ON_ModelComponent::Type::DimStyle,m_archive_current_dim_style->Index());
        if (archive_current_dim_style_map_item.SourceAndDestinationAreSet()
          && ON_UNSET_INT_INDEX != archive_current_dim_style_map_item.DestinationIndex()
          )
        {
          updated_component_index = archive_current_dim_style_map_item.DestinationIndex();
        }
      }
      break;

    case ON_ModelComponent::Type::RenderLight:
      break;
    case ON_ModelComponent::Type::HatchPattern:
      break;
    case ON_ModelComponent::Type::InstanceDefinition:
      break;
    case ON_ModelComponent::Type::ModelGeometry:
      break;
    case ON_ModelComponent::Type::HistoryRecord:
      break;
    default:
      break;
    }
  }

  if (nullptr != component_index)
    *component_index = updated_component_index;

  return true; // true indicates the read worked, even if the component index cannot be updated.
}